

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

char * duckdb_fmt::v6::internal::sprintf_format<long_double>
                 (longdouble value,buffer<char> *buf,sprintf_specs specs)

{
  uint uVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  byte *pbVar6;
  size_t new_size;
  byte *pbVar7;
  byte *__dest;
  byte bVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  char format [10];
  
  format[0] = '%';
  bVar8 = specs.type;
  if (((ulong)specs >> 0x28 & 1) == 0 && bVar8 != 0) {
    pcVar2 = format + 1;
  }
  else {
    pcVar2 = format + 2;
    format[1] = '#';
  }
  if (-1 < specs.precision) {
    pcVar2[0] = '.';
    pcVar2[1] = '*';
    pcVar2 = pcVar2 + 2;
  }
  *pcVar2 = 'L';
  bVar4 = bVar8;
  if (bVar8 == 0x6e) {
    bVar4 = 0x67;
  }
  if (bVar8 == 0) {
    bVar4 = 0x67;
  }
  bVar5 = 0x66;
  if (bVar8 != 0x25) {
    bVar5 = bVar4;
  }
  pcVar2[1] = bVar5;
  pcVar2[2] = '\0';
LAB_01ea106b:
  uVar1 = format_float<long_double>(buf->ptr_,buf->capacity_,format,specs.precision,value);
  if ((int)uVar1 < 0) goto LAB_01ea1099;
  new_size = (size_t)uVar1;
  if (buf->capacity_ <= new_size) {
    uVar10 = (ulong)(uVar1 + 1);
    goto LAB_01ea10a6;
  }
  pbVar6 = (byte *)buf->ptr_;
  if ((*pbVar6 == 0x2d) || (pbVar3 = pbVar6, *pbVar6 == 0x2b)) {
    pbVar3 = pbVar6 + 1;
  }
  if ((bVar8 & 0xdf) != 0x41) {
    pbVar6 = pbVar6 + new_size;
    do {
      pbVar11 = pbVar3;
      pbVar3 = pbVar11 + 1;
      if (pbVar6 <= pbVar11) goto LAB_01ea10f5;
    } while ((byte)(*pbVar11 - 0x30) < 10);
    if ((*pbVar11 | 0x20) != 0x65) {
      if (bVar8 == 0) {
        pbVar7 = pbVar11 + 2;
        if (*pbVar3 != 0x30) {
          pbVar7 = pbVar3;
        }
        for (; (pbVar3 = pbVar6, pbVar9 = pbVar6, __dest = pbVar6, pbVar7 != pbVar6 &&
               (pbVar3 = pbVar7, pbVar9 = pbVar7, __dest = pbVar7, (byte)(*pbVar7 - 0x31) < 9));
            pbVar7 = pbVar7 + 1) {
        }
        for (; pbVar3 != pbVar6; pbVar3 = pbVar3 + 1) {
          if (*pbVar3 != 0x30) {
            if (0xf5 < (byte)(*pbVar3 - 0x3a)) goto LAB_01ea10f8;
            memmove(__dest,pbVar3,(long)pbVar6 - (long)pbVar9);
            pbVar6 = pbVar9;
            break;
          }
          pbVar9 = pbVar9 + 1;
        }
        new_size = (size_t)(uVar1 + ((int)__dest - (int)pbVar6));
      }
      goto LAB_01ea10f8;
    }
  }
LAB_01ea10f5:
  pbVar11 = (byte *)0x0;
LAB_01ea10f8:
  buffer<char>::resize(buf,new_size);
  return (char *)pbVar11;
LAB_01ea1099:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar10 = buf->capacity_ + 1;
LAB_01ea10a6:
    (**buf->_vptr_buffer)(buf,uVar10);
  }
  goto LAB_01ea106b;
}

Assistant:

char* sprintf_format(Double value, internal::buffer<char>& buf,
                     sprintf_specs specs) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { max_format_size = 10 };  // longest format: %#-*.*Lg
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.alt || !specs.type) *format_ptr++ = '#';
  if (specs.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value) *format_ptr++ = 'L';

  char type = specs.type;

  if (type == '%')
    type = 'f';
  else if (type == 0 || type == 'n')
    type = 'g';
#if FMT_MSC_VER
  if (type == 'F') {
    // MSVC's printf doesn't support 'F'.
    type = 'f';
  }
#endif
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  char* start = nullptr;
  char* decimal_point_pos = nullptr;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result =
        format_float(start, buffer_size, format, specs.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        // Find the decimal point.
        auto p = buf.data(), end = p + n;
        if (*p == '+' || *p == '-') ++p;
        if (specs.type != 'a' && specs.type != 'A') {
          while (p < end && *p >= '0' && *p <= '9') ++p;
          if (p < end && *p != 'e' && *p != 'E') {
            decimal_point_pos = p;
            if (!specs.type) {
              // Keep only one trailing zero after the decimal point.
              ++p;
              if (*p == '0') ++p;
              while (p != end && *p >= '1' && *p <= '9') ++p;
              char* where = p;
              while (p != end && *p == '0') ++p;
              if (p == end || *p < '0' || *p > '9') {
                if (p != end) std::memmove(where, p, to_unsigned(end - p));
                n -= static_cast<unsigned>(p - where);
              }
            }
          }
        }
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
  return decimal_point_pos;
}